

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,Node **prev)

{
  bool bVar1;
  Node *n;
  int n_00;
  Node *this_00;
  Node **ppNVar2;
  
  n_00 = (this->max_height_).super___atomic_base<int>._M_i + -1;
  n = this->head_;
  do {
    this_00 = n;
    ppNVar2 = prev + n_00;
    while( true ) {
      n = Node::Next(this_00,n_00);
      bVar1 = KeyIsAfterNode(this,key,n);
      if (bVar1) break;
      if (prev != (Node **)0x0) {
        *ppNVar2 = this_00;
      }
      bVar1 = n_00 == 0;
      n_00 = n_00 + -1;
      if (bVar1) {
        return n;
      }
      ppNVar2 = ppNVar2 + -1;
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindGreaterOrEqual(const Key& key,
                                              Node** prev) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (KeyIsAfterNode(key, next)) {
      // Keep searching in this list
      x = next;
    } else {
      if (prev != nullptr) prev[level] = x;
      if (level == 0) {
        return next;
      } else {
        // Switch to next list
        level--;
      }
    }
  }
}